

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

bool __thiscall cppcms::url_dispatcher::dispatch(url_dispatcher *this,string *url)

{
  _data *p_Var1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  request *this_00;
  pointer psVar6;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  application *this_01;
  string method;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  this_01 = ((this->d).ptr_)->app;
  if ((this_01 == (application *)0x0) || (bVar4 = application::has_context(this_01), !bVar4)) {
    this_01 = (application *)0x0;
    puVar8 = (undefined1 *)0x0;
  }
  else {
    this_00 = application::request(this_01);
    http::request::request_method_abi_cxx11_(&local_50,this_00);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    puVar8 = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      puVar8 = local_70;
    }
  }
  p_Var1 = (this->d).ptr_;
  psVar6 = (p_Var1->options).
           super__Vector_base<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = (p_Var1->options).
          super__Vector_base<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != psVar6;
  if (bVar4) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      peVar2 = psVar6[uVar7].
               super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar5 = (*peVar2->_vptr_option[2])(peVar2,url,puVar8,this_01);
      if ((char)iVar5 != '\0') break;
      p_Var1 = (this->d).ptr_;
      psVar6 = (p_Var1->options).
               super__Vector_base<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(p_Var1->options).
                    super__Vector_base<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4;
      bVar4 = uVar9 < uVar7;
      bVar3 = uVar9 < uVar7;
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar3);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return bVar4;
}

Assistant:

bool url_dispatcher::dispatch(std::string url)
	{
		unsigned i;
		std::string method;
		char const *cmethod = 0;
		application *app = d->app;
		if(app && app->has_context()) {
			method = app->request().request_method();
			cmethod = method.c_str();
		}
		else {
			app = 0;
		}
		for(i=0;i<d->options.size();i++) {
			if(d->options[i]->dispatch(url,cmethod,app))
				return true;
		}
		return false;
	}